

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O0

void * mmap_probe(size_t size)

{
  int iVar1;
  int *piVar2;
  void *__addr;
  size_t in_RDI;
  uintptr_t addr;
  void *p;
  int retry;
  int olderr;
  int local_18;
  
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  local_18 = 0;
  do {
    if (0x1d < local_18) {
      piVar2 = __errno_location();
      *piVar2 = iVar1;
      return (void *)0xffffffffffffffff;
    }
    __addr = mmap64((void *)mmap_probe::hint_addr,in_RDI,3,0x22,-1,0);
    if ((((ulong)__addr >> 0x1f == 0) && ((void *)0x3fff < __addr)) &&
       ((long)__addr + in_RDI >> 0x1f == 0)) {
      mmap_probe::hint_addr = (long)__addr + in_RDI;
      piVar2 = __errno_location();
      *piVar2 = iVar1;
      return __addr;
    }
    if (__addr == (void *)0xffffffffffffffff) {
      piVar2 = __errno_location();
      if (*piVar2 == 0xc) {
        return (void *)0xffffffffffffffff;
      }
    }
    else {
      munmap(__addr,in_RDI);
    }
    if (mmap_probe::hint_addr == 0) {
LAB_0015597f:
      if (mmap_probe::hint_prng == 0) {
        mmap_probe::hint_prng = mmap_probe_seed();
      }
      mmap_probe::hint_addr = (ulong)__addr & 0xfffffffffffff000 ^ mmap_probe::hint_addr;
      do {
        mmap_probe::hint_prng = mmap_probe::hint_prng * 0x41c64e6d + 0x3039;
        mmap_probe::hint_addr =
             (mmap_probe::hint_prng * 0x1000 ^ mmap_probe::hint_addr) & 0x7fffffff;
      } while (mmap_probe::hint_addr < 0x4000);
    }
    else if (local_18 < 5) {
      mmap_probe::hint_addr = mmap_probe::hint_addr + 0x1000000;
      if (mmap_probe::hint_addr + in_RDI >> 0x1f != 0) {
        mmap_probe::hint_addr = 0;
      }
    }
    else {
      if (local_18 != 5) goto LAB_0015597f;
      mmap_probe::hint_addr = 0;
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

static void *mmap_probe(size_t size)
{
  /* Hint for next allocation. Doesn't need to be thread-safe. */
  static uintptr_t hint_addr = 0;
  static uintptr_t hint_prng = 0;
  int olderr = errno;
  int retry;
  for (retry = 0; retry < LJ_ALLOC_MMAP_PROBE_MAX; retry++) {
    void *p = mmap((void *)hint_addr, size, MMAP_PROT, MMAP_FLAGS_PROBE, -1, 0);
    uintptr_t addr = (uintptr_t)p;
    if ((addr >> LJ_ALLOC_MBITS) == 0 && addr >= LJ_ALLOC_MMAP_PROBE_LOWER &&
	((addr + size) >> LJ_ALLOC_MBITS) == 0) {
      /* We got a suitable address. Bump the hint address. */
      hint_addr = addr + size;
      errno = olderr;
      return p;
    }
    if (p != MFAIL) {
      munmap(p, size);
    } else if (errno == ENOMEM) {
      return MFAIL;
    }
    if (hint_addr) {
      /* First, try linear probing. */
      if (retry < LJ_ALLOC_MMAP_PROBE_LINEAR) {
	hint_addr += 0x1000000;
	if (((hint_addr + size) >> LJ_ALLOC_MBITS) != 0)
	  hint_addr = 0;
	continue;
      } else if (retry == LJ_ALLOC_MMAP_PROBE_LINEAR) {
	/* Next, try a no-hint probe to get back an ASLR address. */
	hint_addr = 0;
	continue;
      }
    }
    /* Finally, try pseudo-random probing. */
    if (LJ_UNLIKELY(hint_prng == 0)) {
      hint_prng = mmap_probe_seed();
    }
    /* The unsuitable address we got has some ASLR PRNG bits. */
    hint_addr ^= addr & ~((uintptr_t)(LJ_PAGESIZE-1));
    do {  /* The PRNG itself is very weak, but see above. */
      hint_prng = hint_prng * 1103515245 + 12345;
      hint_addr ^= hint_prng * (uintptr_t)LJ_PAGESIZE;
      hint_addr &= (((uintptr_t)1 << LJ_ALLOC_MBITS)-1);
    } while (hint_addr < LJ_ALLOC_MMAP_PROBE_LOWER);
  }
  errno = olderr;
  return MFAIL;
}